

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Read.cpp
# Opt level: O1

expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *
idx2::ReadChunk(expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *__return_storage_ptr__,
               idx2_file *Idx2,decode_data *D,u64 Brick,i8 Level,i8 Subband,i16 BpKey)

{
  decode_data *pdVar1;
  undefined8 ChunkCache_00;
  bool bVar2;
  int iVar3;
  __off_t _Var4;
  __off_t _Var5;
  ulong uVar6;
  ulong uVar7;
  FILE *pFVar8;
  long lVar9;
  name_map *pnVar10;
  idx2_err_code iVar11;
  byte bVar12;
  unsigned_long *Key;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  char cVar16;
  undefined7 in_register_00000081;
  ulong uVar17;
  chunk_cache *Val;
  undefined7 in_register_00000089;
  str pcVar18;
  undefined4 uVar19;
  ulong *puVar20;
  size_t sVar21;
  ulong uVar22;
  long lVar23;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar24;
  int ChunkSizesSz;
  int ChunkAddrsSz;
  int NChunks;
  timer IOTimer;
  file_id FileId;
  iterator FileCacheIt;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:123:3)>
  __ScopeGuard__123;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:116:3)>
  __ScopeGuard__116;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:112:3)>
  __ScopeGuard__112;
  u64 ChunkAddress;
  u64 ChunkAddr;
  int S;
  file_cache FileCache;
  timer IOTimer_1;
  chunk_cache ChunkCache;
  int local_2dc;
  int local_2d8;
  uint local_2d4;
  undefined4 local_2d0;
  uint local_2cc;
  expected<const_idx2::chunk_cache_*,_idx2::idx2_err_code> *local_2c8;
  idx2_file *local_2c0;
  decode_data *local_2b8;
  timespec local_2b0;
  anon_union_8_2_2df48d06_for_stref_0 local_2a0 [2];
  undefined1 local_290 [16];
  bucket_status *local_280;
  long local_278;
  long local_270;
  buffer *local_268;
  char local_260;
  buffer *local_258;
  char local_250;
  buffer *local_248;
  char local_240;
  undefined1 local_238 [44];
  int local_20c;
  buffer local_208;
  buffer local_1e8;
  undefined1 local_1c8 [48];
  hash_table<unsigned_long,_idx2::chunk_cache> local_198 [3];
  iterator local_f0;
  chunk_cache local_d0;
  
  local_2cc = (uint)CONCAT71(in_register_00000081,Level);
  Key = (unsigned_long *)(CONCAT71(in_register_00000081,Level) & 0xffffffff);
  local_2d0 = (undefined4)CONCAT71(in_register_00000089,Subband);
  local_2c0 = Idx2;
  local_238._24_8_ = Brick;
  ConstructFilePath((file_id *)local_2a0,Idx2,Brick,(i8)Key,Subband,BpKey);
  Lookup<unsigned_long,idx2::file_cache>
            ((iterator *)(local_290 + 8),(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)local_290,Key);
  clock_gettime(1,&local_2b0);
  local_2b8 = D;
  if ((*(char *)(*(long *)(local_278 + 0x10) + local_270) == '\x02') &&
     (local_280[0xc9] == Tombstone)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x60;
    pcVar15 = "";
    uVar19 = 0;
  }
  else {
    pFVar8 = fopen(local_2a0[0].Ptr,"rb");
    if (pFVar8 == (FILE *)0x0) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 99;
      pnVar10 = &idx2_err_code_s::NameMap;
      iVar11 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
      if (idx2_err_code_s::NameMap.Arr[0].ItemVal != FileNotFound) {
        lVar9 = 0x28;
        do {
          if (lVar9 == 0x3b8) {
            iVar11 = __Invalid__;
            goto LAB_00192be3;
          }
          pcVar15 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9);
          lVar9 = lVar9 + 0x18;
        } while (*pcVar15 != '%');
        iVar11 = FileNotFound;
      }
LAB_00192be3:
      if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar11) {
        lVar9 = 0;
        do {
          lVar23 = lVar9;
          if (lVar23 == 0x390) goto LAB_001931df;
          lVar9 = lVar23 + 0x18;
        } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar23] != iVar11);
        pnVar10 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar23);
      }
      lVar9 = *in_FS_OFFSET;
      iVar3 = snprintf((char *)(lVar9 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                       (ulong)(uint)pnVar10->Arr[0].Name.Size,pnVar10->Arr[0].Name.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                       ,99);
      pcVar15 = "File: %s";
      snprintf((char *)(lVar9 + -0xf80) + iVar3,0x400 - (long)iVar3,"File: %s",local_2a0[0].Ptr);
      uVar19 = 0x10025;
    }
    else {
      fseeko(pFVar8,0,2);
      _Var4 = ftello(pFVar8);
      local_20c = 0;
      _Var5 = ftello(pFVar8);
      fseeko(pFVar8,_Var5 + -4,0);
      fread(&local_20c,4,1,pFVar8);
      fseeko(pFVar8,_Var5 + -4,0);
      fseeko(pFVar8,_Var4 - local_20c,0);
      local_2d4 = 0;
      _Var4 = ftello(pFVar8);
      fseeko(pFVar8,_Var4 + -4,0);
      fread(&local_2d4,4,1,pFVar8);
      fseeko(pFVar8,_Var4 + -4,0);
      _Var4 = ftello(pFVar8);
      fseeko(pFVar8,_Var4 + -4,0);
      fread(&local_2d8,4,1,pFVar8);
      fseeko(pFVar8,_Var4 + -4,0);
      if (Mallocator()::Instance == '\0') {
        ReadChunk();
      }
      local_248 = (buffer *)local_238;
      local_238._0_8_ = (unsigned_long *)0x0;
      local_238._8_8_ = (chunk_cache *)0x0;
      local_238._16_8_ = &Mallocator()::Instance;
      local_240 = '\0';
      lVar9 = (long)local_2d8;
      if (Mallocator()::Instance == '\0') {
        ReadChunk();
      }
      AllocBuf((buffer *)local_238,lVar9,(allocator *)&Mallocator()::Instance);
      pdVar1 = local_2b8;
      sVar21 = (size_t)local_2d8;
      if ((long)local_238._8_8_ < (long)sVar21) {
LAB_00193201:
        __assert_fail("Sz <= Size(*Buf)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.h"
                      ,0x9d,"void idx2::ReadBackwardBuffer(FILE *, buffer *, i64)");
      }
      _Var4 = ftello(pFVar8);
      fseeko(pFVar8,_Var4 - sVar21,0);
      fread((void *)local_238._0_8_,sVar21,1,pFVar8);
      fseeko(pFVar8,_Var4 - sVar21,0);
      LOCK();
      (pdVar1->BytesData_).super___atomic_base<unsigned_long>._M_i =
           (pdVar1->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar21;
      UNLOCK();
      clock_gettime(1,(timespec *)local_1c8);
      LOCK();
      (pdVar1->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
           (pdVar1->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
           (long)((double)(local_1c8._0_8_ - local_2b0.tv_sec) * 1000000000.0 +
                 (double)(local_1c8._8_8_ - local_2b0.tv_nsec));
      UNLOCK();
      if (Mallocator()::Instance == '\0') {
        ReadChunk();
      }
      local_258 = &local_1e8;
      local_1e8.Data = (byte *)0x0;
      local_1e8.Bytes = 0;
      local_1e8.Alloc = (allocator *)&Mallocator()::Instance;
      local_250 = '\0';
      lVar9 = (long)(int)local_2d4;
      if (Mallocator()::Instance == '\0') {
        ReadChunk();
      }
      AllocBuf(&local_1e8,lVar9 << 3,(allocator *)&Mallocator()::Instance);
      DecompressBufZstd((buffer *)local_238,&local_1e8);
      clock_gettime(1,(timespec *)local_1c8);
      clock_gettime(1,&local_2b0);
      local_2dc = 0;
      _Var4 = ftello(pFVar8);
      fseeko(pFVar8,_Var4 + -4,0);
      fread(&local_2dc,4,1,pFVar8);
      fseeko(pFVar8,_Var4 + -4,0);
      if (Mallocator()::Instance == '\0') {
        ReadChunk();
      }
      local_268 = &local_208;
      local_208.Data = (byte *)0x0;
      local_208.Bytes = 0;
      local_208.Alloc = (allocator *)&Mallocator()::Instance;
      local_260 = '\0';
      lVar9 = (long)local_2dc;
      if (Mallocator()::Instance == '\0') {
        ReadChunk();
      }
      AllocBuf(&local_208,lVar9,(allocator *)&Mallocator()::Instance);
      if (Mallocator()::Instance == '\0') {
        ReadChunk();
      }
      sVar21 = (size_t)local_2dc;
      if (local_208.Bytes < (long)sVar21) goto LAB_00193201;
      _Var4 = ftello(pFVar8);
      fseeko(pFVar8,_Var4 - sVar21,0);
      fread(local_208.Data,sVar21,1,pFVar8);
      fseeko(pFVar8,_Var4 - sVar21,0);
      LOCK();
      (pdVar1->BytesData_).super___atomic_base<unsigned_long>._M_i =
           (pdVar1->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar21;
      UNLOCK();
      clock_gettime(1,(timespec *)local_1c8);
      puVar20 = (ulong *)local_208.Data;
      LOCK();
      (pdVar1->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
           (pdVar1->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
           (long)((double)(local_1c8._0_8_ - local_2b0.tv_sec) * 1000000000.0 +
                 (double)(local_1c8._8_8_ - local_2b0.tv_nsec));
      UNLOCK();
      uVar7 = *(ulong *)local_208.Data;
      file_cache::file_cache((file_cache *)local_1c8);
      if (Mallocator()::Instance == '\0') {
        ReadChunk();
      }
      Init<unsigned_long,idx2::chunk_cache>
                ((hash_table<unsigned_long,_idx2::chunk_cache> *)(local_1c8 + 0x30),10,
                 (allocator *)&Mallocator()::Instance);
      uVar6 = (ulong)local_2d4;
      local_2c8 = __return_storage_ptr__;
      if (uVar6 != 0) {
        uVar22 = 0;
        pcVar18 = (str)0x0;
        uVar14 = 0;
        do {
          bVar12 = 0;
          lVar9 = 0;
          do {
            if (0x39 < (int)uVar14) {
              uVar7 = *(ulong *)((long)puVar20 + (ulong)(uVar14 >> 3));
              puVar20 = (ulong *)((long)puVar20 + (ulong)(uVar14 >> 3));
              uVar14 = uVar14 & 7;
            }
            uVar17 = uVar7 >> ((byte)uVar14 & 0x3f);
            uVar13 = uVar14 + 7;
            if (0x38 < (int)uVar14) {
              uVar7 = *(ulong *)((long)puVar20 + (ulong)(uVar13 >> 3));
              puVar20 = (ulong *)((long)puVar20 + (ulong)(uVar13 >> 3));
              uVar13 = uVar13 & 7;
            }
            lVar9 = lVar9 + ((uVar17 & bitstream::Masks.Arr[7]) << (bVar12 & 0x3f));
            Val = (chunk_cache *)(uVar7 >> ((byte)uVar13 & 0x3f));
            uVar14 = uVar13 + 1;
            bVar12 = bVar12 + 7;
          } while (((ulong)Val & bitstream::Masks.Arr[1]) != 0);
          local_238._32_8_ = *(undefined8 *)(local_1e8.Data + uVar22 * 8);
          chunk_cache::chunk_cache(&local_d0);
          local_d0.ChunkPos = (i32)uVar22;
          Insert<unsigned_long,idx2::chunk_cache>
                    (&local_f0,(idx2 *)(local_1c8 + 0x30),
                     (hash_table<unsigned_long,_idx2::chunk_cache> *)(local_238 + 0x20),
                     (unsigned_long *)&local_d0,Val);
          if ((long)local_1c8._32_8_ <= (long)local_1c8._24_8_) {
            GrowCapacity<long>((array<long> *)local_1c8,0);
          }
          pcVar18 = pcVar18 + lVar9;
          lVar9 = local_1c8._24_8_ + 1;
          (&((stref *)local_1c8._0_8_)->field_0)[local_1c8._24_8_].Ptr = pcVar18;
          uVar22 = uVar22 + 1;
          local_1c8._24_8_ = lVar9;
        } while (uVar22 != uVar6);
      }
      if (*(char *)(*(long *)(local_278 + 0x10) + local_270) == '\x02') {
        *(bucket_status **)(local_280 + 0x40) = local_198[0].Stats;
        *(i64 *)(local_280 + 0x48) = local_198[0].Size;
        *(i64 *)(local_280 + 0x50) = local_198[0].LogCapacity;
        *(allocator **)(local_280 + 0x58) = local_198[0].Alloc;
        *(unsigned_long **)(local_280 + 0x30) = local_198[0].Keys;
        *(chunk_cache **)(local_280 + 0x38) = local_198[0].Vals;
        *(bucket_status **)(local_280 + 0x40) = local_198[0].Stats;
        *(i64 *)(local_280 + 0x48) = local_198[0].Size;
        *(undefined8 *)local_280 = local_1c8._0_8_;
        *(undefined8 *)(local_280 + 8) = local_1c8._8_8_;
        *(undefined8 *)(local_280 + 0x10) = local_1c8._16_8_;
        *(undefined8 *)(local_280 + 0x18) = local_1c8._24_8_;
        *(undefined8 *)(local_280 + 0x10) = local_1c8._16_8_;
        *(undefined8 *)(local_280 + 0x18) = local_1c8._24_8_;
        *(undefined8 *)(local_280 + 0x20) = local_1c8._32_8_;
        *(ulong *)(local_280 + 0x28) = CONCAT44(local_1c8._44_4_,local_1c8._40_4_);
      }
      else {
        Insert<unsigned_long,idx2::file_cache>
                  ((iterator *)(local_290 + 8),(unsigned_long *)local_290,(file_cache *)local_1c8);
      }
      __return_storage_ptr__ = local_2c8;
      local_280[0xc9] = Tombstone;
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x9e;
      if (local_260 == '\0') {
        DeallocBuf(local_268);
      }
      if (local_250 == '\0') {
        DeallocBuf(local_258);
      }
      if (local_240 == '\0') {
        DeallocBuf(local_248);
      }
      pcVar15 = "";
      uVar19 = 0;
    }
    if (pFVar8 != (FILE *)0x0) {
      fclose(pFVar8);
    }
  }
  if ((char)uVar19 == '\0') {
    if (*(char *)(*(long *)(local_278 + 0x10) + local_270) == '\x02') {
      cVar16 = (char)local_2cc;
      if ('\x0f' < cVar16) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
      }
      uVar7 = (ulong)(local_2c0->BricksPerChunk).Arr[cVar16];
      lVar9 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      bVar12 = -(uVar7 == 0) | (byte)lVar9;
      local_238._0_8_ =
           ((ulong)((ushort)BpKey & 0xfff) |
           (long)((int)(char)local_2d0 << 0xc) + ((ulong)(local_2cc & 0xff) << 0x3c)) +
           ((ulong)local_238._24_8_ >> ((1L << (bVar12 & 0x3f) != uVar7) + bVar12 & 0x3f)) * 0x40000
      ;
      Lookup<unsigned_long,idx2::chunk_cache>
                ((iterator *)local_1c8,(idx2 *)(local_280 + 0x30),
                 (hash_table<unsigned_long,_idx2::chunk_cache> *)local_238,
                 (unsigned_long *)local_238._0_8_);
      ChunkCache_00 = local_1c8._8_8_;
      if ((*(bucket_status **)(local_1c8._16_8_ + 0x10))[local_1c8._24_8_] == Occupied) {
        if ((((bitstream *)(local_1c8._8_8_ + 0x68))->Stream).Bytes == 0) {
          clock_gettime(1,(timespec *)&local_f0);
          pFVar8 = fopen(local_2a0[0].Ptr,"rb");
          if (pFVar8 == (FILE *)0x0) {
            local_1c8._0_8_ = local_2a0;
            eVar24 = ReadChunk::anon_class_8_1_1e916d15::operator()
                               ((anon_class_8_1_1e916d15 *)local_1c8);
            __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0aa0;
            (__return_storage_ptr__->field_1).Val = (chunk_cache *)eVar24.Msg;
            *(short *)((long)&__return_storage_ptr__->field_1 + 8) = eVar24._8_2_;
            (__return_storage_ptr__->field_1).Err.StrGened = eVar24.StrGened;
            __return_storage_ptr__->Ok = false;
          }
          else {
            lVar9 = (long)*(i32 *)ChunkCache_00;
            if (lVar9 < 1) {
              lVar23 = 0;
            }
            else {
              lVar23 = *(long *)((*(undefined8 *)local_280 - 8) + lVar9 * 8);
            }
            lVar9 = *(long *)(*(undefined8 *)local_280 + lVar9 * 8);
            fseeko(pFVar8,lVar23,0);
            if (Mallocator()::Instance == '\0') {
              ReadChunk();
            }
            local_1c8._0_8_ = (anon_union_8_2_2df48d06_for_stref_0 *)0x0;
            local_1c8._8_8_ = (chunk_cache *)0x0;
            local_1c8._16_8_ = &Mallocator()::Instance;
            local_1c8._24_8_ = (byte *)0x0;
            local_1c8._32_8_ = 0;
            local_1c8._40_4_ = 0;
            if (Mallocator()::Instance == '\0') {
              ReadChunk();
            }
            (*(code *)*Mallocator()::Instance)
                      (&Mallocator()::Instance,local_1c8,(lVar9 - lVar23) + 8);
            local_1c8._24_8_ = local_1c8._0_8_;
            local_1c8._40_4_ = 0;
            local_1c8._32_8_ = Empty;
            fread((void *)local_1c8._0_8_,local_1c8._8_8_,1,pFVar8);
            pdVar1 = local_2b8;
            LOCK();
            (local_2b8->BytesData_).super___atomic_base<unsigned_long>._M_i =
                 (long)(i32 *)local_1c8._8_8_ +
                 (local_2b8->BytesData_).super___atomic_base<unsigned_long>._M_i;
            UNLOCK();
            clock_gettime(1,(timespec *)&local_d0);
            LOCK();
            (pdVar1->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
                 (pdVar1->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
                 (long)((double)(CONCAT44(local_d0._4_4_,local_d0.ChunkPos) - (long)local_f0.Key) *
                        1000000000.0 +
                       (double)((long)local_d0.Bricks.Buffer.Data - (long)local_f0.Val));
            UNLOCK();
            uVar7 = (ulong)(local_2c0->BricksPerChunk).Arr[cVar16];
            lVar9 = 0x3f;
            if (uVar7 != 0) {
              for (; uVar7 >> lVar9 == 0; lVar9 = lVar9 + -1) {
              }
            }
            bVar12 = -(uVar7 == 0) | (byte)lVar9;
            DecompressChunk((bitstream *)local_1c8,(chunk_cache *)ChunkCache_00,local_238._0_8_,
                            (int)(char)((1L << (bVar12 & 0x3f) != uVar7) + bVar12));
          }
          if (pFVar8 == (FILE *)0x0) {
            return __return_storage_ptr__;
          }
          fclose(pFVar8);
        }
        __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0aa0;
        (__return_storage_ptr__->field_1).Val = (chunk_cache *)ChunkCache_00;
        bVar2 = true;
      }
      else {
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 199;
        __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0aa0;
        (__return_storage_ptr__->field_1).Val = (chunk_cache *)0x1bd71d;
        (__return_storage_ptr__->field_1).Err.StrGened = false;
        *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x23;
        bVar2 = false;
      }
      __return_storage_ptr__->Ok = bVar2;
      return __return_storage_ptr__;
    }
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xbe;
    pnVar10 = &idx2_err_code_s::NameMap;
    iVar11 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != FileNotFound) {
      lVar9 = 0x28;
      do {
        if (lVar9 == 0x3b8) {
          iVar11 = __Invalid__;
          goto LAB_00192f1e;
        }
        pcVar15 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar9);
        lVar9 = lVar9 + 0x18;
      } while (*pcVar15 != '%');
      iVar11 = FileNotFound;
    }
LAB_00192f1e:
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar11) {
      lVar9 = 0;
      do {
        lVar23 = lVar9;
        if (lVar23 == 0x390) {
LAB_001931df:
          __assert_fail("It != End(EnumS.NameMap)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.h"
                        ,0x38,"stref idx2::ToString(idx2_err_code)");
        }
        lVar9 = lVar23 + 0x18;
      } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar23] != iVar11);
      pnVar10 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar23);
    }
    lVar9 = *in_FS_OFFSET;
    iVar3 = snprintf((char *)(lVar9 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                     (ulong)(uint)pnVar10->Arr[0].Name.Size,pnVar10->Arr[0].Name.field_0.Ptr,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                     ,0xbe);
    snprintf((char *)(lVar9 + -0xf80) + iVar3,0x400 - (long)iVar3,"File: %s\n",local_2a0[0].Ptr);
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0aa0;
    (__return_storage_ptr__->field_1).Val = (chunk_cache *)"File: %s\n";
    (__return_storage_ptr__->field_1).Err.StrGened = true;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x25;
  }
  else {
    *(undefined4 *)(*in_FS_OFFSET + -0x97c) = 0xbc;
    *(char **)(*in_FS_OFFSET + -0xb78) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_001d0aa0;
    (__return_storage_ptr__->field_1).Val = (chunk_cache *)pcVar15;
    (__return_storage_ptr__->field_1).Err.StrGened = SUB41((uint)uVar19 >> 0x10,0);
    *(ushort *)((long)&__return_storage_ptr__->field_1 + 8) = (ushort)uVar19 | 0x100;
  }
  __return_storage_ptr__->Ok = false;
  return __return_storage_ptr__;
}

Assistant:

expected<const chunk_cache*, idx2_err_code>
ReadChunk(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband, i16 BpKey)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
    auto ChunkCacheIt = Lookup(D->FileCache.ChunkCaches, ChunkAddress);
    if (ChunkCacheIt)
      return ChunkCacheIt.Val;

    bitstream ChunkStream;
    bool Result = Idx2.external_read(Idx2, ChunkStream.Stream, ChunkAddress).get();
    idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    //decompress part
    chunk_cache ChunkCache;
    DecompressChunk(&ChunkStream, &ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
    Insert(&ChunkCacheIt, ChunkAddress, ChunkCache);
    return ChunkCacheIt.Val;
  }
#endif

  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, BpKey);
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  idx2_PropagateIfError(ReadFile(Idx2, D, &FileCacheIt, FileId));
  if (!FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
  //printf("chunk %llu\n", ChunkAddress);
  const file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkCaches)::iterator ChunkCacheIt;
  ChunkCacheIt = Lookup(FileCache->ChunkCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);
  chunk_cache* ChunkCache = ChunkCacheIt.Val;
  if (Size(ChunkCache->ChunkStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkCache->ChunkPos;
    i64 ChunkOffset = ChunkPos > 0 ? FileCache->ChunkOffsets[ChunkPos - 1] : 0;
    i64 ChunkSize = FileCache->ChunkOffsets[ChunkPos] - ChunkOffset;
    idx2_FSeek(Fp, ChunkOffset, SEEK_SET);
    bitstream ChunkStream;
    // NOTE: not a memory leak since we will keep track of this in ChunkCache
    InitWrite(&ChunkStream, ChunkSize);
    ReadBuffer(Fp, &ChunkStream.Stream);
    D->BytesData_ += Size(ChunkStream.Stream);
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    // TODO: check for error
    DecompressChunk(&ChunkStream, ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
  }

  return ChunkCacheIt.Val;
}